

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseWhileExpr(Parser *this)

{
  string *in_RSI;
  Token keyword;
  allocator<char> local_71;
  undefined1 local_70 [16];
  _Alloc_hider local_60 [4];
  undefined1 local_40 [48];
  
  Token::Token((Token *)local_40,(Token *)&in_RSI[5].field_2);
  parseExpr((Parser *)(local_70 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"Expected \'{\' or \'=>\' before while loop body.",&local_71);
  expectBlock((Parser *)local_70,in_RSI);
  std::__cxx11::string::~string((string *)local_60);
  std::
  make_unique<enact::WhileExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>,enact::Token>
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_60,
             (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)(local_70 + 8),
             (Token *)local_70);
  this->m_context = (CompileContext *)local_60[0]._M_p;
  if ((CompileContext *)local_70._0_8_ != (CompileContext *)0x0) {
    (**(code **)((((string *)local_70._0_8_)->_M_dataplus)._M_p + 8))();
  }
  if ((long *)local_70._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_70._8_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseWhileExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before while loop body.");

        return std::make_unique<WhileExpr>(std::move(condition), std::move(body), std::move(keyword));
    }